

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

void __thiscall despot::ParticleBelief::Update(ParticleBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  value_type pSVar1;
  DSPOMDP *pDVar2;
  Belief *belief;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  void *this_00;
  log_ostream *plVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  double dVar9;
  double extraout_XMM0_Qa;
  int local_19c;
  undefined1 local_198 [4];
  int i_4;
  undefined1 local_180 [8];
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_belief;
  double num_effective_particles;
  State *particle_2;
  double dStack_150;
  int i_3;
  double weight_square_sum;
  State *particle_1;
  value_type pSStack_138;
  int i_2;
  int local_12c;
  undefined1 local_128 [4];
  int i_1;
  History local_110;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_e0;
  History local_c8;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  double prob;
  byte local_61;
  value_type pSStack_60;
  bool terminal;
  State *particle;
  int i;
  OBS_TYPE o;
  double reward;
  double total_weight;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE obs_local;
  ACT_TYPE action_local;
  ParticleBelief *this_local;
  
  updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)obs;
  History::Add(&(this->super_Belief).history_,action,obs);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&total_weight);
  reward = 0.0;
  for (particle._4_4_ = 0; uVar4 = (ulong)particle._4_4_,
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&this->particles_), uVar4 < sVar5; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)particle._4_4_);
    pSVar1 = *ppSVar6;
    pDVar2 = (this->super_Belief).model_;
    pSStack_60 = pSVar1;
    dVar9 = Random::NextDouble((Random *)&Random::RANDOM);
    iVar3 = (*pDVar2->_vptr_DSPOMDP[2])(dVar9,pDVar2,pSVar1,(ulong)(uint)action,&o);
    local_61 = (byte)iVar3 & 1;
    pDVar2 = (this->super_Belief).model_;
    (*pDVar2->_vptr_DSPOMDP[7])
              (pDVar2,updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pSStack_60,
               (ulong)(uint)action);
    if (((local_61 & 1) == 0) && ((extraout_XMM0_Qa != 0.0 || (NAN(extraout_XMM0_Qa))))) {
      pSStack_60->weight = pSStack_60->weight * extraout_XMM0_Qa;
      reward = reward + pSStack_60->weight;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&total_weight,
                 &stack0xffffffffffffffa0);
    }
    else {
      pDVar2 = (this->super_Belief).model_;
      (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,pSStack_60);
    }
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
    plVar7 = logging::stream(4);
    poVar8 = std::operator<<(&plVar7->super_ostream,"[ParticleBelief::Update] ");
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&total_weight);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar5);
    poVar8 = std::operator<<(poVar8," particles survived among ");
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    this_00 = (void *)std::ostream::operator<<(poVar8,sVar5);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
            (&this->particles_,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&total_weight);
  sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
  if (sVar5 == 0) {
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 1 < iVar3)) {
      plVar7 = logging::stream(2);
      poVar8 = std::operator<<(&plVar7->super_ostream,"Particle set is empty!");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    if (this->prior_ == (Belief *)0x0) {
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 1 < iVar3)) {
        plVar7 = logging::stream(2);
        poVar8 = std::operator<<(&plVar7->super_ostream,
                                 "Resampling by searching initial particles which are consistent with history"
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      iVar3 = this->num_particles_;
      pDVar2 = (this->super_Belief).model_;
      History::History(&local_110,&(this->super_Belief).history_);
      Resample(&local_e0,iVar3,&this->initial_particles_,pDVar2,&local_110,0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
                (&this->particles_,&local_e0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_e0);
      History::~History(&local_110);
    }
    else {
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 1 < iVar3)) {
        plVar7 = logging::stream(2);
        poVar8 = std::operator<<(&plVar7->super_ostream,
                                 "Resampling by drawing random particles from prior which are consistent with history"
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      iVar3 = this->num_particles_;
      belief = this->prior_;
      History::History(&local_c8,&(this->super_Belief).history_);
      Resample(&local_98,iVar3,belief,&local_c8,0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
                (&this->particles_,&local_98);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_98);
      History::~History(&local_c8);
    }
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if ((sVar5 == 0) && (this->state_indexer_ != (StateIndexer *)0x0)) {
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 1 < iVar3)) {
        plVar7 = logging::stream(2);
        poVar8 = std::operator<<(&plVar7->super_ostream,
                                 "Resampling by searching states consistent with last (action, observation) pair"
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      Resample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_128,
               this->num_particles_,(this->super_Belief).model_,this->state_indexer_,action,
               (OBS_TYPE)
               updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
                (&this->particles_,
                 (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_128);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_128);
    }
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if (sVar5 == 0) {
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 1 < iVar3)) {
        plVar7 = logging::stream(2);
        poVar8 = std::operator<<(&plVar7->super_ostream,
                                 "Resampling failed - Using initial particles");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      for (local_12c = 0; uVar4 = (ulong)local_12c,
          sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                            (&this->initial_particles_), uVar4 < sVar5; local_12c = local_12c + 1) {
        pDVar2 = (this->super_Belief).model_;
        ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                            (&this->initial_particles_,(long)local_12c);
        iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,*ppSVar6);
        pSStack_138 = (value_type)CONCAT44(extraout_var,iVar3);
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  (&this->particles_,&stack0xfffffffffffffec8);
      }
    }
    reward = 0.0;
    for (particle_1._4_4_ = 0;
        sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (&this->particles_), (ulong)(long)particle_1._4_4_ < sVar5;
        particle_1._4_4_ = particle_1._4_4_ + 1) {
      ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (&this->particles_,(long)particle_1._4_4_);
      reward = reward + (*ppSVar6)->weight;
    }
  }
  dStack_150 = 0.0;
  for (particle_2._4_4_ = 0;
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&this->particles_), (ulong)(long)particle_2._4_4_ < sVar5;
      particle_2._4_4_ = particle_2._4_4_ + 1) {
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)particle_2._4_4_);
    pSVar1 = *ppSVar6;
    pSVar1->weight = pSVar1->weight / reward;
    dStack_150 = pSVar1->weight * pSVar1->weight + dStack_150;
  }
  new_belief.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 / dStack_150);
  if ((double)new_belief.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage < (double)this->num_particles_ / 2.0
     ) {
    iVar3 = this->num_particles_;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_198,
               &this->particles_);
    Sample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_180,iVar3,
           (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_198,
           (this->super_Belief).model_);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_198);
    for (local_19c = 0;
        sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (&this->particles_), (ulong)(long)local_19c < sVar5;
        local_19c = local_19c + 1) {
      pDVar2 = (this->super_Belief).model_;
      ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (&this->particles_,(long)local_19c);
      (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,*ppSVar6);
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
              (&this->particles_,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_180);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_180);
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&total_weight);
  return;
}

Assistant:

void ParticleBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	history_.Add(action, obs);

	vector<State*> updated;
	double total_weight = 0;
	double reward;
	OBS_TYPE o;
	// Update particles
	for (int i = 0; i <particles_.size(); i++) {
		State* particle = particles_[i];
		bool terminal = model_->Step(*particle, Random::RANDOM.NextDouble(),
			action, reward, o);
		double prob = model_->ObsProb(obs, *particle, action);

		if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
			particle->weight *= prob;
			total_weight += particle->weight;
			updated.push_back(particle);
		} else {
			model_->Free(particle);
		}
	}

	logd << "[ParticleBelief::Update] " << updated.size()
		<< " particles survived among " << particles_.size() << endl;
	particles_ = updated;

	// Resample if the particle set is empty
	if (particles_.size() == 0) {
		logw << "Particle set is empty!" << endl;
		if (prior_ != NULL) {
			logw
				<< "Resampling by drawing random particles from prior which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, *prior_, history_);
		} else {
			logw
				<< "Resampling by searching initial particles which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, initial_particles_, model_,
				history_);
		}

		if (particles_.size() == 0 && state_indexer_ != NULL) {
			logw
				<< "Resampling by searching states consistent with last (action, observation) pair"
				<< endl;
			particles_ = Resample(num_particles_, model_, state_indexer_,
				action, obs);
		}

		if (particles_.size() == 0) {
			logw << "Resampling failed - Using initial particles" << endl;
			for (int i = 0; i < initial_particles_.size(); i ++)
				particles_.push_back(model_->Copy(initial_particles_[i]));
		}

		//Update total weight so that effective number of particles are computed correctly
		total_weight = 0;
                for (int i = 0; i < particles_.size(); i++) {
		    State* particle = particles_[i];
                    total_weight = total_weight + particle->weight;
                }
	}


	double weight_square_sum = 0;
	for (int i = 0; i < particles_.size(); i++) {
		State* particle = particles_[i];
		particle->weight /= total_weight;
		weight_square_sum += particle->weight * particle->weight;
	}

	// Resample if the effective number of particles is "small"
	double num_effective_particles = 1.0 / weight_square_sum;
	if (num_effective_particles < num_particles_ / 2.0) {
		vector<State*> new_belief = Sample(num_particles_, particles_,
			model_);
		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = new_belief;
	}
}